

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_AddItemToObject(cJSON *object,char *string,cJSON *item)

{
  cJSON *pcVar1;
  size_t sVar2;
  char *__dest;
  cJSON *pcVar3;
  
  if (item != (cJSON *)0x0) {
    if (item->string != (char *)0x0) {
      (*cJSON_free)(item->string);
    }
    sVar2 = strlen(string);
    __dest = (char *)(*cJSON_malloc)(sVar2 + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,string,sVar2 + 1);
    }
    item->string = __dest;
    pcVar1 = object->child;
    if (object->child == (cJSON *)0x0) {
      object->child = item;
    }
    else {
      do {
        pcVar3 = pcVar1;
        pcVar1 = pcVar3->next;
      } while (pcVar3->next != (cJSON *)0x0);
      pcVar3->next = item;
      item->prev = pcVar3;
    }
  }
  return;
}

Assistant:

void   cJSON_AddItemToObject(cJSON *object,const char *string,cJSON *item)	{if (!item) return; if (item->string) cJSON_free(item->string);item->string=cJSON_strdup(string);cJSON_AddItemToArray(object,item);}